

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::ColumnDescriptor>::construct
          (BasicTypeInfo<dap::ColumnDescriptor> *this,void *ptr)

{
  memset(ptr,0,0xa0);
  *(long *)ptr = (long)ptr + 0x10;
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined1 *)((long)ptr + 0x10) = 0;
  *(long *)((long)ptr + 0x20) = (long)ptr + 0x30;
  *(undefined8 *)((long)ptr + 0x28) = 0;
  *(undefined1 *)((long)ptr + 0x30) = 0;
  *(undefined1 *)((long)ptr + 0x40) = 0;
  *(long *)((long)ptr + 0x48) = (long)ptr + 0x58;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  *(undefined1 *)((long)ptr + 0x58) = 0;
  *(long *)((long)ptr + 0x68) = (long)ptr + 0x78;
  *(undefined8 *)((long)ptr + 0x70) = 0;
  *(undefined1 *)((long)ptr + 0x78) = 0;
  *(undefined1 *)((long)ptr + 0x88) = 0;
  *(undefined8 *)((long)ptr + 0x90) = 0;
  *(undefined1 *)((long)ptr + 0x98) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }